

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib572.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  long lVar2;
  void *__ptr;
  FILE *__stream;
  int iVar3;
  stat file_info;
  stat64 sStack_b8;
  
  iVar1 = curl_global_init(3);
  if (iVar1 != 0) {
    test_cold_1();
    return 0x7e;
  }
  lVar2 = curl_easy_init();
  if (lVar2 == 0) {
    test_cold_3();
    return 0x7e;
  }
  iVar1 = curl_easy_setopt(lVar2,0x272d,_stdout);
  if ((((iVar1 == 0) && (iVar1 = curl_easy_setopt(lVar2,0x2711,_stdout), iVar1 == 0)) &&
      (iVar1 = curl_easy_setopt(lVar2,0x29,1), iVar1 == 0)) &&
     (iVar1 = curl_easy_setopt(lVar2,0x2712,URL), iVar1 == 0)) {
    __ptr = (void *)curl_maprintf("%s%.4d",URL,1);
    iVar3 = 0x7e;
    iVar1 = iVar3;
    if (__ptr != (void *)0x0) {
      __stream = (FILE *)0x0;
      iVar1 = curl_easy_setopt(lVar2,0x27cf,__ptr);
      if (iVar1 != 0) goto LAB_001013d5;
      free(__ptr);
      iVar1 = curl_easy_setopt(lVar2,0x27d0,"Planes/Trains/Automobiles");
      if (((iVar1 == 0) && (iVar1 = curl_easy_setopt(lVar2,0xbd,4), iVar1 == 0)) &&
         ((iVar1 = curl_easy_perform(lVar2), iVar1 == 0 &&
          (__ptr = (void *)curl_maprintf("%s%.4d",URL,2), iVar1 = iVar3, __ptr != (void *)0x0)))) {
        __stream = (FILE *)0x0;
        iVar1 = curl_easy_setopt(lVar2,0x27cf,__ptr);
        if (iVar1 != 0) goto LAB_001013d5;
        free(__ptr);
        iVar1 = open64("log/file572.txt",0);
        fstat64(iVar1,&sStack_b8);
        close(iVar1);
        __stream = fopen64("log/file572.txt","rb");
        if (__stream == (FILE *)0x0) {
          test_cold_2();
          iVar1 = 0x7e;
        }
        else {
          __ptr = (void *)0x0;
          iVar1 = curl_easy_setopt(lVar2,0xbd,8);
          if (iVar1 != 0) goto LAB_001013d5;
          __ptr = (void *)0x0;
          iVar1 = curl_easy_setopt(lVar2,0x2719,__stream);
          if (iVar1 != 0) goto LAB_001013d5;
          __ptr = (void *)0x0;
          iVar1 = curl_easy_setopt(lVar2,0x2e,1);
          if (iVar1 != 0) goto LAB_001013d5;
          __ptr = (void *)0x0;
          iVar1 = curl_easy_setopt(lVar2,0x75a3,sStack_b8.st_size);
          if (iVar1 != 0) goto LAB_001013d5;
          iVar1 = curl_easy_perform(lVar2);
          __ptr = (void *)0x0;
          if ((iVar1 != 0) || (iVar1 = curl_easy_setopt(lVar2,0x2e,0), iVar1 != 0))
          goto LAB_001013d5;
          fclose(__stream);
          __ptr = (void *)curl_maprintf("%s%.4d",URL,3);
          iVar1 = iVar3;
          if (__ptr != (void *)0x0) {
            __stream = (FILE *)0x0;
            iVar1 = curl_easy_setopt(lVar2,0x27cf,__ptr);
            if (iVar1 != 0) goto LAB_001013d5;
            free(__ptr);
            iVar1 = curl_easy_perform(lVar2);
            if ((iVar1 == 0) &&
               (__ptr = (void *)curl_maprintf("%s%.4d",URL,4), iVar1 = iVar3, __ptr != (void *)0x0))
            {
              __stream = (FILE *)0x0;
              iVar1 = curl_easy_setopt(lVar2,0x27cf,__ptr);
              if (iVar1 != 0) goto LAB_001013d5;
              free(__ptr);
              iVar1 = curl_easy_setopt(lVar2,0xbd,8);
              if ((((iVar1 == 0) &&
                   (iVar1 = curl_easy_setopt(lVar2,0x271f,"packets_received\njitter\n"), iVar1 == 0)
                   ) && (iVar1 = curl_easy_perform(lVar2), iVar1 == 0)) &&
                 ((iVar1 = curl_easy_setopt(lVar2,0x271f,0), iVar1 == 0 &&
                  (__ptr = (void *)curl_maprintf("%s%.4d",URL,5), iVar1 = iVar3,
                  __ptr != (void *)0x0)))) {
                __stream = (FILE *)0x0;
                iVar1 = curl_easy_setopt(lVar2,0x27cf,__ptr);
                if (iVar1 != 0) goto LAB_001013d5;
                free(__ptr);
                iVar1 = curl_easy_setopt(lVar2,0xbd,1);
                if (iVar1 == 0) {
                  iVar1 = curl_easy_perform(lVar2);
                }
              }
            }
          }
        }
      }
    }
  }
  __stream = (FILE *)0x0;
  __ptr = (void *)0x0;
LAB_001013d5:
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  curl_easy_cleanup(lVar2);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  int res;
  CURL *curl;
  int params;
  FILE *paramsf = NULL;
  struct_stat file_info;
  char *stream_uri = NULL;
  int request=1;
  struct curl_slist *custom_headers=NULL;

  if (curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  if ((curl = curl_easy_init()) == NULL) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }


  test_setopt(curl, CURLOPT_HEADERDATA, stdout);
  test_setopt(curl, CURLOPT_WRITEDATA, stdout);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  test_setopt(curl, CURLOPT_URL, URL);

  /* SETUP */
  if((stream_uri = suburl(URL, request++)) == NULL) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;

  test_setopt(curl, CURLOPT_RTSP_TRANSPORT, "Planes/Trains/Automobiles");
  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_SETUP);
  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  if((stream_uri = suburl(URL, request++)) == NULL) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;

  /* PUT style GET_PARAMETERS */
  params = open("log/file572.txt", O_RDONLY);
  fstat(params, &file_info);
  close(params);

  paramsf = fopen("log/file572.txt", "rb");
  if(paramsf == NULL) {
    fprintf(stderr, "can't open log/file572.txt\n");
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_GET_PARAMETER);

  test_setopt(curl, CURLOPT_READDATA, paramsf);
  test_setopt(curl, CURLOPT_UPLOAD, 1L);
  test_setopt(curl, CURLOPT_INFILESIZE_LARGE, (curl_off_t) file_info.st_size);

  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  test_setopt(curl, CURLOPT_UPLOAD, 0L);
  fclose(paramsf);
  paramsf = NULL;

  /* Heartbeat GET_PARAMETERS */
  if((stream_uri = suburl(URL, request++)) == NULL) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;

  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  /* POST GET_PARAMETERS */

  if((stream_uri = suburl(URL, request++)) == NULL) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;

  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_GET_PARAMETER);
  test_setopt(curl, CURLOPT_POSTFIELDS, "packets_received\njitter\n");

  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  test_setopt(curl, CURLOPT_POSTFIELDS, NULL);

  /* Make sure we can do a normal request now */
  if((stream_uri = suburl(URL, request++)) == NULL) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;

  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_OPTIONS);
  res = curl_easy_perform(curl);

test_cleanup:

  if(paramsf)
    fclose(paramsf);

  if(stream_uri)
    free(stream_uri);

  if(custom_headers)
    curl_slist_free_all(custom_headers);

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}